

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndTabItem(void)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabBar *pIVar2;
  
  if (((GImGui->CurrentWindow->SkipItems == false) &&
      (pIVar2 = GImGui->CurrentTabBar, pIVar2 != (ImGuiTabBar *)0x0)) &&
     (((pIVar2->Tabs).Data[pIVar2->LastTabItemIdx].Flags & 8) == 0)) {
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar != NULL && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}